

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::FillerParameter::MergePartialFromCodedStream(FillerParameter *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  string *value_00;
  char *data;
  UnknownFieldSet *pUVar6;
  bool local_89;
  FillerParameter_VarianceNorm local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  FillerParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x1000049c = input;
LAB_0075a2fb:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar5 = ::std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                              (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar5 = ::std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) goto switchD_0075a512_default;
    iVar3 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    switch(iVar3) {
    case 1:
      if ((p.first & 0xff) == 10) {
        value_00 = mutable_type_abi_cxx11_(this);
        bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,value_00);
        if (!bVar2) {
          return false;
        }
        type_abi_cxx11_(this);
        data = (char *)::std::__cxx11::string::data();
        type_abi_cxx11_(this);
        iVar3 = ::std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (data,iVar3,PARSE,"caffe.FillerParameter.type");
        goto LAB_0075a2fb;
      }
      break;
    case 2:
      if ((p.first & 0xff) != 0x15) break;
      set_has_value(this);
      bVar2 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (stack0xffffffffffffff98,&this->value_);
      goto joined_r0x0075a6fc;
    case 3:
      if ((p.first & 0xff) == 0x1d) {
        set_has_min(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->min_);
        goto joined_r0x0075a6fc;
      }
      break;
    case 4:
      if ((p.first & 0xff) == 0x25) {
        set_has_max(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->max_);
        goto joined_r0x0075a6fc;
      }
      break;
    case 5:
      if ((p.first & 0xff) == 0x2d) {
        set_has_mean(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->mean_);
        goto joined_r0x0075a6fc;
      }
      break;
    case 6:
      if ((p.first & 0xff) == 0x35) {
        set_has_std(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->std_);
        goto joined_r0x0075a6fc;
      }
      break;
    case 7:
      if ((p.first & 0xff) == 0x38) {
        set_has_sparse(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (stack0xffffffffffffff98,&this->sparse_);
        goto joined_r0x0075a6fc;
      }
      break;
    case 8:
      if ((p.first & 0xff) == 0x40) {
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_78);
        if (!bVar2) {
          return false;
        }
        bVar2 = FillerParameter_VarianceNorm_IsValid(local_78);
        if (bVar2) {
          set_variance_norm(this,local_78);
        }
        else {
          pUVar6 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar6,8,(long)(int)local_78);
        }
        goto LAB_0075a2fb;
      }
    }
switchD_0075a512_default:
    if ((p.first == 0) ||
       (WVar4 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
       pCVar1 = stack0xffffffffffffff98, tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
      return true;
    }
    pUVar6 = mutable_unknown_fields(this);
    bVar2 = google::protobuf::internal::WireFormat::SkipField(pCVar1,tag_00,pUVar6);
joined_r0x0075a6fc:
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool FillerParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.FillerParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string type = 1 [default = "constant"];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type().data(), this->type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.FillerParameter.type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float value = 2 [default = 0];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float min = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_min();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &min_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float max = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {
          set_has_max();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &max_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float mean = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          set_has_mean();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &mean_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float std = 6 [default = 1];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(53u)) {
          set_has_std();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &std_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 sparse = 7 [default = -1];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_sparse();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &sparse_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::FillerParameter_VarianceNorm_IsValid(value)) {
            set_variance_norm(static_cast< ::caffe::FillerParameter_VarianceNorm >(value));
          } else {
            mutable_unknown_fields()->AddVarint(8, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.FillerParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.FillerParameter)
  return false;
#undef DO_
}